

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O1

void __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::parseNamespaceDeclarations
          (ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           *this,ParserAttributes *attributes)

{
  int iVar1;
  _Base_ptr p_Var2;
  StringHash SVar3;
  StringHash *pSVar4;
  xmlChar **ppxVar5;
  _Elt_pointer pNVar6;
  _Rb_tree_header *p_Var7;
  StringHashPair SVar8;
  StringHash name;
  NamespaceStackFrame stackFrame;
  unsigned_long local_70;
  value_type local_68;
  key_type local_30;
  
  ppxVar5 = attributes->attributes;
  if (ppxVar5 != (xmlChar **)0x0) {
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68.counter = 0;
    pNVar6 = (this->mNamespacesStack).c.
             super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pNVar6 != (this->mNamespacesStack).c.
                  super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pNVar6 == (this->mNamespacesStack).c.
                    super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pNVar6 = (this->mNamespacesStack).c.
                 super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
      }
      p_Var2 = pNVar6[-1].namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = &pNVar6[-1].namespaces._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var2 != p_Var7) {
        do {
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::_M_insert_unique<std::pair<unsigned_long_const,unsigned_long>const&>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      *)&local_68,(pair<const_unsigned_long,_unsigned_long> *)(p_Var2 + 1));
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        } while ((_Rb_tree_header *)p_Var2 != p_Var7);
      }
    }
    do {
      if (*ppxVar5 == (ParserChar *)0x0) {
        iVar1 = 6;
      }
      else {
        SVar8 = Utils::calculateStringHashWithNamespace(*ppxVar5);
        local_70 = SVar8.second;
        if (local_70 == 0x7f4353 && SVar8.first == 0) {
          SVar3 = Utils::calculateStringHash(ppxVar5[1]);
          local_30 = 0;
          pSVar4 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[](&local_68.namespaces,&local_30);
LAB_006de552:
          *pSVar4 = SVar3;
        }
        else if (SVar8.first == 0x7f4353) {
          SVar3 = Utils::calculateStringHash(ppxVar5[1]);
          pSVar4 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[](&local_68.namespaces,&local_70);
          goto LAB_006de552;
        }
        ppxVar5 = ppxVar5 + 2;
        iVar1 = 0;
      }
    } while (iVar1 == 0);
    if ((iVar1 == 6) && (local_68.namespaces._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
    {
      std::
      deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
      ::push_back(&(this->mNamespacesStack).c,&local_68);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)&local_68);
  }
  return;
}

Assistant:

void ParserTemplate<DerivedClass, ImplClass>::parseNamespaceDeclarations( const ParserAttributes& attributes )
    {
        const ParserChar** attributeArray = attributes.attributes;
        if ( attributeArray )
        {
            NamespaceStackFrame stackFrame;
            if ( !mNamespacesStack.empty() )
            {
                const NamespaceStackFrame& topElement = mNamespacesStack.top();
                typename NamespacePrefixesMap::const_iterator it = topElement.namespaces.begin();
                for (; it != topElement.namespaces.end(); ++it)
                {
                    stackFrame.namespaces.insert(*it);
                }
            }
            while (true)
            {
                const ParserChar * attribute = *attributeArray;
                if ( !attribute )
                    break;
                StringHashPair hashPair = GeneratedSaxParser::Utils::calculateStringHashWithNamespace(attribute);
                attributeArray++;
                if ( !attributeArray )
                    return;
                const ParserChar* attributeValue = *attributeArray;
                attributeArray++;

                StringHash prefix = hashPair.first;
                StringHash name = hashPair.second;
                if ( prefix == 0 && name == XML_ATTRIBUTE_XMLNS_HASH )
                {
                    // set default namespace
                    stackFrame.namespaces[ 0 ] = GeneratedSaxParser::Utils::calculateStringHash( attributeValue );
                }
                else if ( prefix == XML_ATTRIBUTE_XMLNS_HASH )
                {
                    // set namespace with prefix
                    stackFrame.namespaces[ name ] = GeneratedSaxParser::Utils::calculateStringHash( attributeValue );
                }
            }
            if ( !stackFrame.namespaces.empty() )
            {
                mNamespacesStack.push( stackFrame );
            }
        }
    }